

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O1

void __thiscall
cm::uv_handle_deleter<uv_handle_s>::operator()
          (uv_handle_deleter<uv_handle_s> *this,uv_handle_s *type_handle)

{
  int iVar1;
  
  if (type_handle != (uv_handle_s *)0x0) {
    iVar1 = uv_is_closing(type_handle);
    if (iVar1 != 0) {
      __assert_fail("!uv_is_closing(handle)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmUVHandlePtr.cxx"
                    ,0x40,"void cm::handle_default_delete(T *) [T = uv_handle_s]");
    }
    iVar1 = uv_is_closing(type_handle);
    if (iVar1 == 0) {
      uv_close(type_handle,handle_default_delete<uv_handle_s>::anon_class_1_0_00000001::__invoke);
      return;
    }
  }
  return;
}

Assistant:

static void handle_default_delete(T* type_handle)
{
  auto* handle = reinterpret_cast<uv_handle_t*>(type_handle);
  if (handle) {
    assert(!uv_is_closing(handle));
    if (!uv_is_closing(handle)) {
      uv_close(handle, [](uv_handle_t* h) { free(h); });
    }
  }
}